

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnvironmentType.cpp
# Opt level: O0

KBOOL __thiscall
KDIS::DATA_TYPE::EnvironmentType::operator==(EnvironmentType *this,EnvironmentType *Value)

{
  EnvironmentType *Value_local;
  EnvironmentType *this_local;
  
  if (this->m_ui8EntityKind == Value->m_ui8EntityKind) {
    if (this->m_ui8Domain == Value->m_ui8Domain) {
      if (this->m_ui16Class == Value->m_ui16Class) {
        if (this->m_ui8Category == Value->m_ui8Category) {
          if (this->m_ui8SubCategory == Value->m_ui8SubCategory) {
            if (this->m_ui8Specific == Value->m_ui8Specific) {
              if (this->m_ui8Extra == Value->m_ui8Extra) {
                this_local._7_1_ = true;
              }
              else {
                this_local._7_1_ = false;
              }
            }
            else {
              this_local._7_1_ = false;
            }
          }
          else {
            this_local._7_1_ = false;
          }
        }
        else {
          this_local._7_1_ = false;
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

KBOOL EnvironmentType::operator == ( const EnvironmentType & Value ) const
{
    if( m_ui8EntityKind  != Value.m_ui8EntityKind )  return false;
    if( m_ui8Domain      != Value.m_ui8Domain )      return false;
    if( m_ui16Class      != Value.m_ui16Class )    return false;
    if( m_ui8Category    != Value.m_ui8Category )    return false;
    if( m_ui8SubCategory != Value.m_ui8SubCategory ) return false;
    if( m_ui8Specific    != Value.m_ui8Specific )    return false;
    if( m_ui8Extra       != Value.m_ui8Extra )       return false;
    return true;
}